

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

Locale * icu_63::Locale::getEnglish(void)

{
  UBool UVar1;
  undefined8 *puVar2;
  size_t in_RSI;
  Locale *pLVar3;
  Locale *this;
  long lVar4;
  Locale LStack_110;
  
  if ((gLocaleCacheInitOnce != 2) &&
     (UVar1 = umtx_initImplPreInit((UInitOnce *)&gLocaleCacheInitOnce), UVar1 != '\0')) {
    puVar2 = (undefined8 *)UMemory::operator_new__((UMemory *)0x10a8,in_RSI);
    if (puVar2 == (undefined8 *)0x0) {
      pLVar3 = (Locale *)0x0;
    }
    else {
      *puVar2 = 0x13;
      pLVar3 = (Locale *)(puVar2 + 1);
      lVar4 = 0;
      this = pLVar3;
      do {
        Locale(this);
        lVar4 = lVar4 + -0xe0;
        this = this + 1;
      } while (lVar4 != -0x10a0);
    }
    gLocaleCache = pLVar3;
    if (pLVar3 == (Locale *)0x0) {
      _DAT_003bb29c = 7;
    }
    else {
      ucln_common_registerCleanup_63(UCLN_COMMON_LOCALE,locale_cleanup);
      Locale(&LStack_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0x12,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"en",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"fr",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 1,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"de",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 2,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"it",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 3,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"ja",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 4,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"ko",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 5,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"zh",(char *)0x0,(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 6,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"fr","FR",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 7,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"de","DE",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 8,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"it","IT",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 9,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"ja","JP",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 10,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"ko","KR",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0xb,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"zh","CN",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0xc,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"zh","TW",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0xd,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"en","GB",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0xe,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"en","US",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0xf,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"en","CA",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0x10,&LStack_110);
      ~Locale(&LStack_110);
      Locale(&LStack_110,"fr","CA",(char *)0x0,(char *)0x0);
      operator=(gLocaleCache + 0x11,&LStack_110);
      ~Locale(&LStack_110);
      _DAT_003bb29c = 0;
    }
    umtx_initImplPostInit((UInitOnce *)&gLocaleCacheInitOnce);
  }
  return gLocaleCache;
}

Assistant:

const Locale &
Locale::getLocale(int locid)
{
    Locale *localeCache = getLocaleCache();
    U_ASSERT((locid < eMAX_LOCALES)&&(locid>=0));
    if (localeCache == NULL) {
        // Failure allocating the locale cache.
        //   The best we can do is return a NULL reference.
        locid = 0;
    }
    return localeCache[locid]; /*operating on NULL*/
}